

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O1

void __thiscall
COLLADASaxFWL::KinematicLink::addAttachment(KinematicLink *this,KinematicAttachment *attachement)

{
  pointer *pppKVar1;
  iterator __position;
  KinematicAttachment *local_8;
  
  __position._M_current =
       (this->mAttachments).
       super__Vector_base<COLLADASaxFWL::KinematicAttachment_*,_std::allocator<COLLADASaxFWL::KinematicAttachment_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->mAttachments).
      super__Vector_base<COLLADASaxFWL::KinematicAttachment_*,_std::allocator<COLLADASaxFWL::KinematicAttachment_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = attachement;
    std::
    vector<COLLADASaxFWL::KinematicAttachment*,std::allocator<COLLADASaxFWL::KinematicAttachment*>>
    ::_M_realloc_insert<COLLADASaxFWL::KinematicAttachment*const&>
              ((vector<COLLADASaxFWL::KinematicAttachment*,std::allocator<COLLADASaxFWL::KinematicAttachment*>>
                *)&this->mAttachments,__position,&local_8);
  }
  else {
    *__position._M_current = attachement;
    pppKVar1 = &(this->mAttachments).
                super__Vector_base<COLLADASaxFWL::KinematicAttachment_*,_std::allocator<COLLADASaxFWL::KinematicAttachment_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppKVar1 = *pppKVar1 + 1;
  }
  return;
}

Assistant:

void addAttachment( KinematicAttachment* attachement ) { mAttachments.push_back(attachement); }